

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_closure(lua_State *L,CallInfo *ci,LClosure *cl,int a,int Bx)

{
  StkId base_00;
  Proto *p_00;
  int iVar1;
  LClosure *pLVar2;
  StkId ra_00;
  LClosure *x_;
  TValue *io;
  StkId ra;
  LClosure *ncl;
  Proto *p;
  StkId base;
  int Bx_local;
  int a_local;
  LClosure *cl_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  base_00 = (ci->u).l.base;
  p_00 = cl->p->p[Bx];
  pLVar2 = getcached(p_00,cl->upvals,base_00);
  ra_00 = base_00 + a;
  if (pLVar2 == (LClosure *)0x0) {
    pushclosure(L,p_00,cl->upvals,base_00,ra_00);
  }
  else {
    if (9 < (pLVar2->tt & 0xf)) {
      __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb7f,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)");
    }
    (ra_00->value_).gc = (GCObject *)pLVar2;
    ra_00->tt_ = 0x8006;
    if ((ra_00->tt_ & 0x8000) != 0) {
      if ((ra_00->tt_ & 0x8000) == 0) {
        __assert_fail("(((io)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb7f,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)")
        ;
      }
      if ((ra_00->tt_ & 0x7f) != (ushort)((ra_00->value_).gc)->tt) {
LAB_001645d0:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb7f,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)")
        ;
      }
      if (L != (lua_State *)0x0) {
        if ((ra_00->tt_ & 0x8000) == 0) {
          __assert_fail("(((io)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xb7f,
                        "void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)");
        }
        if ((((ra_00->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_001645d0;
      }
    }
  }
  if (0 < L->l_G->GCdebt) {
    L->top = ra_00 + 1;
    luaC_step(L);
    L->top = ci->top;
  }
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xb81,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)");
  }
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xb81,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)");
  }
  return;
}

Assistant:

void raviV_op_closure(lua_State *L, CallInfo *ci, LClosure *cl, int a, int Bx) {
  StkId base = ci->u.l.base;
  Proto *p = cl->p->p[Bx];
  LClosure *ncl = getcached(p, cl->upvals, base); /* cached closure */
  StkId ra = base + a;
  if (ncl == NULL) /* no match? */ {
    pushclosure(L, p, cl->upvals, base, ra); /* create a new one */
  }
  else {
    setclLvalue(L, ra, ncl); /* push cashed closure */
  }
  checkGC_protectbase(L, ra + 1);
}